

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

wstring * __thiscall
ROM::Request::description_abi_cxx11_
          (wstring *__return_storage_ptr__,Request *this,int description_flags,wchar_t bullet_point)

{
  anon_class_16_3_21f2e8b1 local_1d8;
  function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
  local_1c8;
  wstringstream local_1a8 [8];
  wstringstream output;
  wchar_t bullet_point_local;
  int description_flags_local;
  Request *this_local;
  
  std::__cxx11::wstringstream::wstringstream(local_1a8);
  local_1d8.output = (wstringstream *)local_1a8;
  local_1d8.description_flags = description_flags;
  local_1d8.bullet_point = bullet_point;
  std::
  function<void(ROM::Request::LineItem,ROM::Request::ListType,int,ROM::Description_const*,bool,unsigned_long)>
  ::function<ROM::Request::description[abi:cxx11](int,wchar_t)::__0,void>
            ((function<void(ROM::Request::LineItem,ROM::Request::ListType,int,ROM::Description_const*,bool,unsigned_long)>
              *)&local_1c8,&local_1d8);
  visit(this,&local_1c8);
  std::
  function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
  ::~function(&local_1c8);
  std::__cxx11::wstringstream::str();
  std::__cxx11::wstringstream::~wstringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Request::description(int description_flags, wchar_t bullet_point) {
	std::wstringstream output;

	visit(
		[&output, description_flags, bullet_point] (ROM::Request::LineItem item, ROM::Request::ListType type, int indentation_level, const ROM::Description *description, bool is_optional, size_t remaining) {
			if(indentation_level) {
				output << std::endl;
				for(int c = 0; c < indentation_level; c++) output << '\t';
				output << bullet_point << ' ';
			}

			switch(item) {
				case ROM::Request::LineItem::NewList:
					if(remaining > 1) {
						if(!indentation_level) output << " ";
						switch(type) {
							default:
							case ROM::Request::ListType::All:	output << "all of:";		break;
							case ROM::Request::ListType::Any:
								if(remaining == 2) {
									output << "either of:";
								} else {
									output << "any of:";
								}
							break;
						}
					} else {
						output << ":";
					}
				break;

				case ROM::Request::LineItem::Description: {
					if(is_optional) output << "optionally, ";

					const auto text = description->description(description_flags);
					std::wstring wide_text(text.size(), L' ');
					std::mbstowcs(wide_text.data(), text.data(), text.size());
					output << wide_text;

					if(remaining) {
						output << ";";
						if(remaining == 1) {
							output << ((type == ROM::Request::ListType::All) ? " and" : " or");
						}
					} else {
						output << ".";
					}
				} break;
			}
		}
	);

	return output.str();
}